

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  cmMakefile *this_00;
  string *psVar4;
  reference pbVar5;
  cmValue cVar6;
  bool local_3f9;
  bool local_397;
  bool local_395;
  bool local_391;
  undefined1 local_370 [8];
  string impProp_2;
  undefined1 local_348 [8];
  string locProp_2;
  char local_301;
  string local_300;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  iterator aci;
  string local_2c8;
  cmValue local_2a8;
  cmValue iconfigs;
  cmList availableConfigs;
  string local_280;
  string *local_260;
  string *local_258;
  string *local_250;
  undefined1 local_248 [8];
  string impProp_1;
  undefined1 local_220 [8];
  string locProp_1;
  string local_1f8;
  string *local_1d8;
  undefined1 local_1d0 [8];
  string impProp;
  char local_1a1;
  undefined1 local_1a0 [8];
  string locProp;
  string mcUpper;
  string local_158;
  string *local_138;
  string *local_130;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  iterator mci;
  cmValue cStack_110;
  bool allowImp;
  cmValue mapValue;
  string mapProp;
  cmList mappedConfigs;
  string local_c8;
  undefined1 local_a8 [8];
  string locPropBase;
  string local_78;
  undefined1 local_58 [8];
  string config_upper;
  string *suffix_local;
  cmValue *imp_local;
  cmValue *loc_local;
  string *desired_config_local;
  cmTarget *this_local;
  
  config_upper.field_2._8_8_ = suffix;
  std::__cxx11::string::string((string *)local_58);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_78,desired_config);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::string((string *)local_a8);
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    std::__cxx11::string::operator=((string *)local_a8,"IMPORTED_LIBNAME");
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == OBJECT_LIBRARY) {
      std::__cxx11::string::operator=((string *)local_a8,"IMPORTED_OBJECTS");
    }
    else {
      std::__cxx11::string::operator=((string *)local_a8,"IMPORTED_LOCATION");
    }
  }
  mappedConfigs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x5f;
  cmStrCat<char,std::__cxx11::string&>
            (&local_c8,
             (char *)((long)&mappedConfigs.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  cmList::cmList((cmList *)((long)&mapProp.field_2 + 8));
  cmStrCat<char_const(&)[21],std::__cxx11::string&>
            ((string *)&mapValue,(char (*) [21])"MAP_IMPORTED_CONFIG_",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  cStack_110 = GetProperty(this,(string *)&mapValue);
  bVar1 = cmValue::operator_cast_to_bool(&stack0xfffffffffffffef0);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&stack0xfffffffffffffef0);
    cmList::assign((cmList *)((long)&mapProp.field_2 + 8),psVar4,Yes);
  }
  std::__cxx11::string::~string((string *)&mapValue);
  TVar2 = GetType(this);
  local_391 = true;
  if (TVar2 != SHARED_LIBRARY) {
    bVar1 = IsExecutableWithExports(this);
    local_391 = true;
    if (!bVar1) {
      bVar1 = IsAIX(this);
      if (bVar1) {
        bVar1 = IsExecutableWithExports(this);
        local_391 = true;
        if (bVar1) goto LAB_00345e76;
      }
      this_00 = GetMakefile(this);
      bVar1 = cmMakefile::PlatformSupportsAppleTextStubs(this_00);
      local_395 = false;
      if (bVar1) {
        local_395 = IsSharedLibraryWithExports(this);
      }
      local_391 = local_395;
    }
  }
LAB_00345e76:
  mci._M_current._7_1_ = local_391;
  local_120._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmList::begin_abi_cxx11_((cmList *)((long)&mapProp.field_2 + 8));
  while( true ) {
    bVar1 = cmValue::operator_cast_to_bool(loc);
    local_397 = false;
    if (!bVar1) {
      bVar1 = cmValue::operator_cast_to_bool(imp);
      local_397 = false;
      if (!bVar1) {
        local_128._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmList::end_abi_cxx11_((cmList *)((long)&mapProp.field_2 + 8));
        local_397 = __gnu_cxx::operator!=(&local_120,&local_128);
      }
    }
    if (local_397 == false) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_120);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_120);
      cmsys::SystemTools::UpperCase((string *)((long)&locProp.field_2 + 8),pbVar5);
      local_1a1 = '_';
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                ((string *)local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_1a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&locProp.field_2 + 8));
      impProp.field_2._8_8_ = GetProperty(this,(string *)local_1a0);
      loc->Value = (string *)impProp.field_2._8_8_;
      if ((mci._M_current._7_1_ & 1) != 0) {
        cmStrCat<char_const(&)[17],std::__cxx11::string&>
                  ((string *)local_1d0,(char (*) [17])"IMPORTED_IMPLIB_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&locProp.field_2 + 8));
        local_1d8 = (string *)GetProperty(this,(string *)local_1d0);
        imp->Value = local_1d8;
        std::__cxx11::string::~string((string *)local_1d0);
      }
      bVar1 = cmValue::operator_cast_to_bool(loc);
      if ((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
        locProp_1.field_2._M_local_buf[0xf] = '_';
        cmStrCat<char,std::__cxx11::string&>
                  (&local_1f8,locProp_1.field_2._M_local_buf + 0xf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&locProp.field_2 + 8));
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)(locProp.field_2._M_local_buf + 8));
    }
    else {
      local_130 = (string *)GetProperty(this,(string *)local_a8);
      loc->Value = local_130;
      if ((mci._M_current._7_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"IMPORTED_IMPLIB",
                   (allocator<char> *)(mcUpper.field_2._M_local_buf + 0xf));
        local_138 = (string *)GetProperty(this,&local_158);
        imp->Value = local_138;
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)(mcUpper.field_2._M_local_buf + 0xf));
      }
      bVar1 = cmValue::operator_cast_to_bool(loc);
      if ((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
        std::__cxx11::string::clear();
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_120);
  }
  bVar1 = cmList::empty((cmList *)((long)&mapProp.field_2 + 8));
  if (((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(loc), bVar1)) ||
     (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(imp), !bVar1)) {
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                ((string *)local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 config_upper.field_2._8_8_);
      impProp_1.field_2._8_8_ = GetProperty(this,(string *)local_220);
      loc->Value = (string *)impProp_1.field_2._8_8_;
      if ((mci._M_current._7_1_ & 1) != 0) {
        cmStrCat<char_const(&)[16],std::__cxx11::string&>
                  ((string *)local_248,(char (*) [16])0xff9df8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   config_upper.field_2._8_8_);
        local_250 = (string *)GetProperty(this,(string *)local_248);
        imp->Value = local_250;
        std::__cxx11::string::~string((string *)local_248);
      }
      std::__cxx11::string::~string((string *)local_220);
    }
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(imp), !bVar1)) {
      std::__cxx11::string::clear();
      local_258 = (string *)GetProperty(this,(string *)local_a8);
      loc->Value = local_258;
      if ((mci._M_current._7_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"IMPORTED_IMPLIB",
                   (allocator<char> *)
                   ((long)&availableConfigs.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_260 = (string *)GetProperty(this,&local_280);
        imp->Value = local_260;
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&availableConfigs.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(imp), !bVar1)) {
      cmList::cmList((cmList *)&iconfigs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"IMPORTED_CONFIGURATIONS",
                 (allocator<char> *)((long)&aci._M_current + 7));
      local_2a8 = GetProperty(this,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&aci._M_current + 7));
      bVar1 = cmValue::operator_cast_to_bool(&local_2a8);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_2a8);
        cmList::assign((cmList *)&iconfigs,psVar4,Yes,No);
      }
      local_2d8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmList::begin_abi_cxx11_((cmList *)&iconfigs);
      while( true ) {
        bVar1 = cmValue::operator_cast_to_bool(loc);
        local_3f9 = false;
        if (!bVar1) {
          bVar1 = cmValue::operator_cast_to_bool(imp);
          local_3f9 = false;
          if (!bVar1) {
            local_2e0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 cmList::end_abi_cxx11_((cmList *)&iconfigs);
            local_3f9 = __gnu_cxx::operator!=(&local_2d8,&local_2e0);
          }
        }
        if (local_3f9 == false) break;
        local_301 = '_';
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2d8);
        cmsys::SystemTools::UpperCase((string *)((long)&locProp_2.field_2 + 8),pbVar5);
        cmStrCat<char,std::__cxx11::string>
                  (&local_300,&local_301,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&locProp_2.field_2 + 8));
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)(locProp_2.field_2._M_local_buf + 8));
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                  ((string *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   config_upper.field_2._8_8_);
        impProp_2.field_2._8_8_ = GetProperty(this,(string *)local_348);
        loc->Value = (string *)impProp_2.field_2._8_8_;
        if ((mci._M_current._7_1_ & 1) != 0) {
          cmStrCat<char_const(&)[16],std::__cxx11::string&>
                    ((string *)local_370,(char (*) [16])0xff9df8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     config_upper.field_2._8_8_);
          cVar6 = GetProperty(this,(string *)local_370);
          imp->Value = (string *)cVar6;
          std::__cxx11::string::~string((string *)local_370);
        }
        std::__cxx11::string::~string((string *)local_348);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2d8);
      }
      cmList::~cmList((cmList *)&iconfigs);
    }
    bVar1 = cmValue::operator_cast_to_bool(loc);
    if ((bVar1) || (bVar1 = cmValue::operator_cast_to_bool(imp), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      TVar2 = GetType(this);
      this_local._7_1_ = TVar2 == INTERFACE_LIBRARY;
    }
  }
  else {
    TVar2 = GetType(this);
    this_local._7_1_ = TVar2 == INTERFACE_LIBRARY;
  }
  locProp_1.field_2._8_4_ = 1;
  cmList::~cmList((cmList *)((long)&mapProp.field_2 + 8));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  cmList mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      mappedConfigs.assign(*mapValue, cmList::EmptyElements::Yes);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // There may be only IMPORTED_IMPLIB for a shared library or an executable
  // with exports.
  bool allowImp = (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->GetMakefile()->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    cmList availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      availableConfigs.assign(*iconfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}